

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoad *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value)

{
  Vector<float,_4> *__value;
  GLenum internalformat_00;
  bool bVar1;
  GLuint GVar2;
  GLenum format;
  GLenum type;
  GLint location;
  char *src_fs;
  reference pixels;
  undefined8 uVar3;
  string local_c8;
  Vector<float,_4> local_a4;
  uint local_94;
  GLuint local_90;
  GLuint unit;
  GLuint texture;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  int kSize;
  string local_60;
  GLuint local_3c;
  char *pcStack_38;
  GLuint program;
  char *src_vs;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *value_local;
  BasicAllFormatsLoad *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsLoad *this_local;
  
  pcStack_38 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenFS<tcu::Vector<float,4>>(&local_60,this,internalformat,expected_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  __value = expected_value_local;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  local_3c = GVar2;
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&unit + 3));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&texture,
             0x100,__value,(allocator<tcu::Vector<float,_4>_> *)((long)&unit + 3));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&unit + 3));
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),1,&local_90);
  local_94 = 0;
  do {
    if (7 < local_94) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,&local_90);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      this_local._7_1_ = 1;
LAB_01037c7b:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&texture)
      ;
      return (bool)(this_local._7_1_ & 1);
    }
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,local_90);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
    internalformat_00 = value_local._4_4_;
    format = ShaderImageLoadStoreBase::Format<tcu::Vector<float,4>>
                       ((ShaderImageLoadStoreBase *)this);
    type = ShaderImageLoadStoreBase::Type<tcu::Vector<float,4>>((ShaderImageLoadStoreBase *)this);
    pixels = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &texture,0);
    glu::CallLogWrapper::glTexImage2D
              ((CallLogWrapper *)(this + 8),0xde1,0,internalformat_00,0x10,0x10,0,format,type,pixels
              );
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
    glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
    glu::CallLogWrapper::glClear((CallLogWrapper *)(this + 8),0x4000);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_3c);
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)(this + 8),local_94,local_90,0,'\0',0,35000,value_local._4_4_);
    glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
    tcu::Vector<float,_4>::Vector(&local_a4,0.0,1.0,0.0,1.0);
    bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                      ((ShaderImageLoadStoreBase *)this,0,0,0x10,0x10,&local_a4);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,&local_90);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_c8,(ShaderImageLoadStoreBase *)this,value_local._4_4_);
      uVar3 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("Bad load value. Format is: %s. Unit is: %d.\n",uVar3,(ulong)local_94);
      std::__cxx11::string::~string((string *)&local_c8);
      this_local._7_1_ = 0;
      goto LAB_01037c7b;
    }
    if (local_94 < 7) {
      location = glu::CallLogWrapper::glGetUniformLocation
                           ((CallLogWrapper *)(this + 8),local_3c,"g_image");
      glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),location,local_94 + 1);
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint   program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, expected_value).c_str());
		const int	  kSize   = 16;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture;
		glGenTextures(1, &texture);

		for (GLuint unit = 0; unit < 8; ++unit)
		{
			glBindTexture(GL_TEXTURE_2D, texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);

			glViewport(0, 0, kSize, kSize);
			glClear(GL_COLOR_BUFFER_BIT);
			glUseProgram(program);
			glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
			glBindVertexArray(m_vao);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

			if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
			{
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Bad load value. Format is: %s. Unit is: %d.\n", FormatEnumToString(internalformat).c_str(),
					   unit);
				return false;
			}

			if (unit < 7)
			{
				glUniform1i(glGetUniformLocation(program, "g_image"), static_cast<GLint>(unit + 1));
			}
		}

		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);

		return true;
	}